

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obu.c
# Opt level: O0

int get_last_nonzero_byte_index(uint8_t *data,size_t sz)

{
  bool bVar1;
  int i;
  size_t sz_local;
  uint8_t *data_local;
  
  i = (int)sz;
  do {
    i = i + -1;
    bVar1 = false;
    if (-1 < i) {
      bVar1 = data[i] == '\0';
    }
  } while (bVar1);
  return i;
}

Assistant:

static int get_last_nonzero_byte_index(const uint8_t *data, size_t sz) {
  // Scan backward and return on the first nonzero byte.
  int i = (int)sz - 1;
  while (i >= 0 && data[i] == 0) {
    --i;
  }
  return i;
}